

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trade.cpp
# Opt level: O0

void Handlers::Trade_Accept(Character *character,PacketReader *reader)

{
  bool bVar1;
  unsigned_short uVar2;
  int iVar3;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  undefined1 local_58 [8];
  PacketBuilder builder;
  Character *victim;
  int victimid;
  PacketReader *reader_local;
  Character *character_local;
  
  if (((character->trading & 1U) == 0) && (bVar1 = Character::CanInteractItems(character), bVar1)) {
    PacketReader::GetChar(reader);
    uVar2 = PacketReader::GetShort(reader);
    builder.add_size = (size_t)Map::GetCharacterPID(character->map,(uint)uVar2);
    if ((((Character *)builder.add_size != (Character *)0x0) &&
        (((((Character *)builder.add_size)->mapid == character->mapid &&
          (((Character *)builder.add_size)->trade_partner == character)) &&
         ((((Character *)builder.add_size)->trading & 1U) == 0)))) &&
       (bVar1 = Character::CanInteractItems((Character *)builder.add_size), bVar1)) {
      PacketBuilder::PacketBuilder((PacketBuilder *)local_58,PACKET_TRADE,PACKET_OPEN,0x1e);
      iVar3 = Character::PlayerID((Character *)builder.add_size);
      PacketBuilder::AddShort((PacketBuilder *)local_58,(unsigned_short)iVar3);
      (**(code **)(*(long *)builder.add_size + 0x10))(&local_88);
      PacketBuilder::AddBreakString((PacketBuilder *)local_58,&local_88,0xff);
      std::__cxx11::string::~string((string *)&local_88);
      iVar3 = Character::PlayerID(character);
      PacketBuilder::AddShort((PacketBuilder *)local_58,(unsigned_short)iVar3);
      (*(character->super_Command_Source)._vptr_Command_Source[2])(&local_a8);
      PacketBuilder::AddBreakString((PacketBuilder *)local_58,&local_a8,0xff);
      std::__cxx11::string::~string((string *)&local_a8);
      Character::Send(character,(PacketBuilder *)local_58);
      PacketBuilder::Reset((PacketBuilder *)local_58,0x1e);
      iVar3 = Character::PlayerID(character);
      PacketBuilder::AddShort((PacketBuilder *)local_58,(unsigned_short)iVar3);
      (*(character->super_Command_Source)._vptr_Command_Source[2])(&local_c8);
      PacketBuilder::AddBreakString((PacketBuilder *)local_58,&local_c8,0xff);
      std::__cxx11::string::~string((string *)&local_c8);
      iVar3 = Character::PlayerID((Character *)builder.add_size);
      PacketBuilder::AddShort((PacketBuilder *)local_58,(unsigned_short)iVar3);
      (**(code **)(*(long *)builder.add_size + 0x10))(&local_e8);
      PacketBuilder::AddBreakString((PacketBuilder *)local_58,&local_e8,0xff);
      std::__cxx11::string::~string((string *)&local_e8);
      Character::Send((Character *)builder.add_size,(PacketBuilder *)local_58);
      character->trade_partner = (Character *)builder.add_size;
      character->trading = true;
      character->trade_agree = false;
      *(undefined1 *)(builder.add_size + 0x152) = 1;
      *(undefined1 *)(builder.add_size + 0x160) = 0;
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_58);
    }
  }
  return;
}

Assistant:

void Trade_Accept(Character *character, PacketReader &reader)
{
	if (character->trading) return;
	if (!character->CanInteractItems()) return;

	/*int accept =*/ reader.GetChar();
	int victimid = reader.GetShort();

	Character *victim(character->map->GetCharacterPID(victimid));

	if (victim && victim->mapid == character->mapid && victim->trade_partner == character
	 && !victim->trading && victim->CanInteractItems())
	{
		PacketBuilder builder(PACKET_TRADE, PACKET_OPEN, 30);
		builder.AddShort(victim->PlayerID());
		builder.AddBreakString(victim->SourceName());
		builder.AddShort(character->PlayerID());
		builder.AddBreakString(character->SourceName());
		character->Send(builder);

		builder.Reset(30);
		builder.AddShort(character->PlayerID());
		builder.AddBreakString(character->SourceName());
		builder.AddShort(victim->PlayerID());
		builder.AddBreakString(victim->SourceName());
		victim->Send(builder);

		character->trade_partner = victim;
		character->trading = true;
		character->trade_agree = false;
		victim->trading = true;
		victim->trade_agree = false;
	}
}